

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

char * next_log_token(void)

{
  size_t sVar1;
  char *local_30;
  char local_21;
  long lStack_20;
  char c;
  long filepos;
  int rbpos;
  
  filepos._4_4_ = 0;
  loginfo.last_token_start = ftell((FILE *)loginfo.flog);
  lStack_20 = loginfo.last_token_start;
  while( true ) {
    if (next_log_token::rbuflen <= filepos._4_4_) {
      next_log_token::rbuflen = next_log_token::rbuflen << 1;
      if (next_log_token::rbuflen < 0x100) {
        next_log_token::rbuflen = 0x100;
      }
      next_log_token::rbuf = (char *)realloc(next_log_token::rbuf,(long)next_log_token::rbuflen);
    }
    if (loginfo.endpos <= (ulong)(filepos._4_4_ + lStack_20)) break;
    sVar1 = fread(&local_21,1,1,(FILE *)loginfo.flog);
    if (sVar1 != 1) {
      raw_printf("Unexpected EOF or error in save file");
      terminate();
    }
    next_log_token::rbuf[filepos._4_4_] = local_21;
    if (((local_21 == '\r') || (local_21 == '\n')) || (local_21 == ' ')) {
      if (filepos._4_4_ != 0) {
        next_log_token::rbuf[filepos._4_4_] = '\0';
        return next_log_token::rbuf;
      }
    }
    else {
      filepos._4_4_ = filepos._4_4_ + 1;
    }
  }
  next_log_token::rbuf[filepos._4_4_] = '\0';
  if (filepos._4_4_ == 0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = next_log_token::rbuf;
  }
  return local_30;
}

Assistant:

static char *next_log_token(void)
{
    static char *rbuf = NULL;
    static int rbuflen = 0;

    int rbpos = 0;
    long filepos = ftell(loginfo.flog);

    loginfo.last_token_start = filepos;
    while (1) {
	char c;
	if (rbpos >= rbuflen) {
	    rbuflen *= 2;
	    if (rbuflen < 256) rbuflen = 256;
	    rbuf = realloc(rbuf, rbuflen);
	}
	if (rbpos + filepos >= loginfo.endpos) {
	    rbuf[rbpos] = 0;
	    return rbpos ? rbuf : NULL;
	}
	if (fread(&c, 1, 1, loginfo.flog) != 1) {
	    raw_printf("Unexpected EOF or error in save file");
	    terminate();
	}
	rbuf[rbpos] = c;
	if (c == '\r' || c == '\n' || c == ' ') {
	    if (rbpos != 0) break;
	    /* otherwise overwrite the redundant whitespace the next time
	     * round the loop */
	} else {
	    rbpos++;
	}
    }
    rbuf[rbpos] = 0;
    return rbuf;
}